

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

JavaType google::protobuf::compiler::java::GetJavaType(FieldDescriptor *field)

{
  Type TVar1;
  JavaType JVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar1 = GetType(field);
  if (TVar1 - TYPE_DOUBLE < 0x12) {
    JVar2 = *(JavaType *)(&DAT_0039aaf8 + (ulong)(TVar1 - TYPE_DOUBLE) * 4);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x169);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    JVar2 = JAVATYPE_INT;
  }
  return JVar2;
}

Assistant:

JavaType GetJavaType(const FieldDescriptor* field) {
  switch (GetType(field)) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
      return JAVATYPE_INT;

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      return JAVATYPE_LONG;

    case FieldDescriptor::TYPE_FLOAT:
      return JAVATYPE_FLOAT;

    case FieldDescriptor::TYPE_DOUBLE:
      return JAVATYPE_DOUBLE;

    case FieldDescriptor::TYPE_BOOL:
      return JAVATYPE_BOOLEAN;

    case FieldDescriptor::TYPE_STRING:
      return JAVATYPE_STRING;

    case FieldDescriptor::TYPE_BYTES:
      return JAVATYPE_BYTES;

    case FieldDescriptor::TYPE_ENUM:
      return JAVATYPE_ENUM;

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return JAVATYPE_MESSAGE;

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return JAVATYPE_INT;
}